

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int mbedtls_ssl_close_notify(mbedtls_ssl_context *ssl)

{
  int iVar1;
  
  iVar1 = -0x7100;
  if ((ssl != (mbedtls_ssl_context *)0x0) && (ssl->conf != (mbedtls_ssl_config *)0x0)) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0x1a5e,"=> write close notify");
    if (ssl->out_left != 0) {
      iVar1 = mbedtls_ssl_flush_output(ssl);
      return iVar1;
    }
    if ((ssl->state == 0x10) &&
       (iVar1 = mbedtls_ssl_send_alert_message(ssl,'\x01','\0'), iVar1 != 0)) {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0x1a69,"mbedtls_ssl_send_alert_message",iVar1);
      return iVar1;
    }
    iVar1 = 0;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0x1a6e,"<= write close notify");
  }
  return iVar1;
}

Assistant:

int mbedtls_ssl_close_notify( mbedtls_ssl_context *ssl )
{
    int ret;

    if( ssl == NULL || ssl->conf == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> write close notify" ) );

    if( ssl->out_left != 0 )
        return( mbedtls_ssl_flush_output( ssl ) );

    if( ssl->state == MBEDTLS_SSL_HANDSHAKE_OVER )
    {
        if( ( ret = mbedtls_ssl_send_alert_message( ssl,
                        MBEDTLS_SSL_ALERT_LEVEL_WARNING,
                        MBEDTLS_SSL_ALERT_MSG_CLOSE_NOTIFY ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_send_alert_message", ret );
            return( ret );
        }
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= write close notify" ) );

    return( 0 );
}